

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRSInterface.cpp
# Opt level: O2

int connectrazorahrsinterface(RS232PORT *pRazorAHRSInterfacePseudoRS232Port)

{
  int iVar1;
  
  iVar1 = OpenRS232Port(pRazorAHRSInterfacePseudoRS232Port,szRazorAHRSInterfacePath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(pRazorAHRSInterfacePseudoRS232Port,RazorAHRSInterfaceBaudRate,'\0',0
                                ,'\b','\0',RazorAHRSInterfaceTimeout);
    if (iVar1 == 0) {
      puts("RazorAHRSInterface connected.");
      return 0;
    }
    puts("Unable to connect to a RazorAHRSInterface.");
    CloseRS232Port(pRazorAHRSInterfacePseudoRS232Port);
  }
  else {
    puts("Unable to connect to a RazorAHRSInterface.");
  }
  return 1;
}

Assistant:

int connectrazorahrsinterface(RS232PORT* pRazorAHRSInterfacePseudoRS232Port)
{
	if (OpenRS232Port(pRazorAHRSInterfacePseudoRS232Port, szRazorAHRSInterfacePath) != EXIT_SUCCESS) 
	{
		printf("Unable to connect to a RazorAHRSInterface.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(pRazorAHRSInterfacePseudoRS232Port, RazorAHRSInterfaceBaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)RazorAHRSInterfaceTimeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RazorAHRSInterface.\n");
		CloseRS232Port(pRazorAHRSInterfacePseudoRS232Port);
		return EXIT_FAILURE;
	}

	printf("RazorAHRSInterface connected.\n");

	return EXIT_SUCCESS;
}